

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
Corrade::Containers::Implementation::
CallDeleter<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
::operator()(CallDeleter<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
             *this,_func_void_Entry_ptr_size_t *deleter,Entry *data,size_t size)

{
  long lVar1;
  
  if (deleter != (_func_void_Entry_ptr_size_t *)0x0) {
    (*deleter)(data,size);
    return;
  }
  if (data != (Entry *)0x0) {
    if (data[-1].id != 0) {
      lVar1 = data[-1].id * 0xb0;
      do {
        Utility::Arguments::Entry::~Entry((Entry *)(&data[-1].type + lVar1));
        lVar1 = lVar1 + -0xb0;
      } while (lVar1 != 0);
    }
    operator_delete__(&data[-1].id);
    return;
  }
  return;
}

Assistant:

void operator()(void(*deleter)(T*, std::size_t), T* data, std::size_t size) const {
            if(deleter) deleter(data, size);
            /** @todo could this have some compile-time check for type
                completeness like Pointer has with IsComplete, but one that
                doesn't trigger if the deleter is set? having that checked only
                at runtime feels awful */
            else delete[] data;
        }